

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult
testing::internal::EqHelper<false>::Compare<int,__0>
          (char *expected_expression,char *actual_expression,int *expected,anon_enum_32 *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar2;
  stringstream ss;
  String SStack_1d8;
  string local_1c8;
  string local_1a8 [12];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (*(int *)actual_expression == *expected) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    PrintToString<int>(local_1a8,(int *)actual_expression);
    String::String(&SStack_1d8,local_1a8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::ostream::_M_insert<long_long>((longlong)&local_1a8[0].field_2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    String::String((String *)local_1a8,&local_1c8);
    std::__cxx11::string::_M_dispose();
    EqFailure((internal *)expected_expression,"r","CUBEB_OK",&SStack_1d8,(String *)local_1a8,false);
    String::~String((String *)local_1a8);
    String::~String(&SStack_1d8);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = expected_expression;
  return AVar2;
}

Assistant:

static AssertionResult Compare(const char* expected_expression,
                                 const char* actual_expression,
                                 const T1& expected,
                                 const T2& actual) {
    return CmpHelperEQ(expected_expression, actual_expression, expected,
                       actual);
  }